

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

void slide_hash(deflate_state *s)

{
  uint uVar1;
  Posf local_2c;
  Posf local_28;
  Posf *pPStack_20;
  uInt wsize;
  Posf *p;
  uint m;
  uint n;
  deflate_state *s_local;
  
  uVar1 = s->w_size;
  p._4_4_ = s->hash_size;
  pPStack_20 = s->head + p._4_4_;
  do {
    if (pPStack_20[-1] < uVar1) {
      local_28 = 0;
    }
    else {
      local_28 = pPStack_20[-1] - (short)uVar1;
    }
    pPStack_20[-1] = local_28;
    p._4_4_ = p._4_4_ - 1;
    pPStack_20 = pPStack_20 + -1;
  } while (p._4_4_ != 0);
  pPStack_20 = s->prev + uVar1;
  p._4_4_ = uVar1;
  do {
    if (pPStack_20[-1] < uVar1) {
      local_2c = 0;
    }
    else {
      local_2c = pPStack_20[-1] - (short)uVar1;
    }
    pPStack_20[-1] = local_2c;
    p._4_4_ = p._4_4_ - 1;
    pPStack_20 = pPStack_20 + -1;
  } while (p._4_4_ != 0);
  return;
}

Assistant:

local void slide_hash(deflate_state *s) {
    unsigned n, m;
    Posf *p;
    uInt wsize = s->w_size;

    n = s->hash_size;
    p = &s->head[n];
    do {
        m = *--p;
        *p = (Pos)(m >= wsize ? m - wsize : NIL);
    } while (--n);
    n = wsize;
#ifndef FASTEST
    p = &s->prev[n];
    do {
        m = *--p;
        *p = (Pos)(m >= wsize ? m - wsize : NIL);
        /* If n is not on any hash chain, prev[n] is garbage but
         * its value will never be used.
         */
    } while (--n);
#endif
}